

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MacroArgumentDefaultSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,TokenList *args_1)

{
  Info *pIVar1;
  size_type sVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  MacroArgumentDefaultSyntax *pMVar9;
  
  pMVar9 = (MacroArgumentDefaultSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroArgumentDefaultSyntax *)this->endPtr < pMVar9 + 1) {
    pMVar9 = (MacroArgumentDefaultSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pMVar9 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  (pMVar9->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar9->super_SyntaxNode).kind = MacroArgumentDefault;
  (pMVar9->equals).kind = TVar3;
  (pMVar9->equals).field_0x2 = uVar4;
  (pMVar9->equals).numFlags = (NumericTokenFlags)NVar5.raw;
  (pMVar9->equals).rawLen = uVar6;
  (pMVar9->equals).info = pIVar1;
  SVar7 = (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.kind = SVar7;
  *(undefined4 *)&(pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar8;
  (pMVar9->tokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pMVar9->tokens).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar2 = (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (pMVar9->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (pMVar9->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar2;
  (pMVar9->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00507e50;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.parent = &pMVar9->super_SyntaxNode;
  return pMVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }